

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5IndexFlush(Fts5Index *p)

{
  uchar *p_00;
  Fts5StructureSegment *pFVar1;
  Fts5Structure *pStruct_00;
  u8 *pTerm;
  undefined8 pStruct_01;
  long lVar2;
  int iVar3;
  Fts5Hash *pFVar4;
  Fts5Index *pFVar5;
  int *piVar6;
  Fts5Hash *pFVar7;
  int *piVar8;
  Fts5Index *pFVar9;
  u8 uVar10;
  int iVar11;
  int iVar12;
  size_t sVar13;
  u64 v;
  int iVar14;
  uchar *p_01;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  undefined8 in_R8;
  int iVar18;
  uint uVar19;
  Fts5Hash *p_02;
  long lVar20;
  int *pRc;
  u32 dummy;
  int pgnoLast;
  Fts5Structure *pStruct;
  int nDoclist;
  u8 *pDoclist;
  char *zTerm;
  Fts5SegWriter writer;
  uint local_14c;
  int local_148;
  int local_144;
  Fts5Structure *local_140;
  int local_134;
  u8 *local_130;
  uchar *local_128;
  ulong local_120;
  int local_114;
  uint local_110;
  int local_10c;
  size_t local_108;
  u64 local_100;
  u64 local_f8;
  u8 *local_f0;
  u8 *local_e8;
  Fts5SegWriter local_e0;
  Fts5Hash *local_68;
  Fts5Structure *local_60;
  Fts5Index *local_58;
  long local_50;
  int *local_48;
  ulong local_40;
  long local_38;
  
  if (p->nPendingData != 0) {
    p->nPendingData = 0;
    p_02 = p->pHash;
    local_144 = 0;
    local_140 = fts5StructureRead(p);
    local_60 = local_140;
    iVar11 = fts5AllocateSegid(p,local_140);
    if (p->pStruct != (Fts5Structure *)0x0) {
      fts5StructureRelease(p->pStruct);
      p->pStruct = (Fts5Structure *)0x0;
    }
    if (iVar11 != 0) {
      iVar14 = p->pConfig->eDetail;
      local_148 = p->pConfig->pgsz;
      local_114 = iVar11;
      fts5WriteInit(p,&local_e0,iVar11);
      pRc = &p->rc;
      if (p->rc == 0) {
        iVar11 = sqlite3Fts5HashScanInit(p_02,(char *)0x0,0);
        *pRc = iVar11;
      }
      iVar18 = (int)in_R8;
      iVar11 = *pRc;
      pFVar7 = p_02;
      iVar12 = iVar14;
      piVar8 = pRc;
      pFVar9 = p;
      iVar3 = local_134;
      pFVar4 = local_68;
      pFVar5 = local_58;
      piVar6 = local_48;
      while (local_58 = pFVar9, local_48 = piVar8, local_134 = iVar12, local_68 = pFVar7,
            iVar11 == 0) {
        iVar18 = (int)in_R8;
        iVar3 = local_134;
        pFVar4 = local_68;
        pFVar5 = local_58;
        piVar6 = local_48;
        if (p_02->pScan == (Fts5HashEntry *)0x0) break;
        sqlite3Fts5HashScanEntry(p_02,(char **)&local_e8,&local_f0,&local_10c);
        pTerm = local_e8;
        sVar13 = strlen((char *)local_e8);
        fts5WriteAppendTerm(p,&local_e0,(int)sVar13,pTerm);
        iVar18 = (int)in_R8;
        iVar3 = local_134;
        pFVar4 = local_68;
        pFVar5 = local_58;
        piVar6 = local_48;
        if (p->rc != 0) break;
        sVar13 = (size_t)local_10c;
        iVar11 = local_10c + local_e0.writer.buf.n;
        if (local_e0.writer.pgidx.n + iVar11 < local_148) {
          memcpy(local_e0.writer.buf.p + local_e0.writer.buf.n,local_f0,sVar13);
          local_e0.writer.buf.n = iVar11;
        }
        else {
          local_f8 = 0;
          p_02 = local_68;
          local_108 = sVar13;
          if (0 < local_10c) {
            local_100 = 0;
            local_130 = local_f0;
            iVar18 = 0;
            iVar11 = local_148;
            do {
              uVar10 = sqlite3Fts5GetVarint(local_130 + iVar18,&local_f8);
              iVar3 = local_e0.writer.buf.n;
              local_120 = CONCAT71(local_120._1_7_,uVar10);
              v = local_100 + local_f8;
              local_100 = v;
              if (local_e0.bFirstRowidInPage == '\0') {
                local_e0.writer.buf.n =
                     sqlite3Fts5PutVarint(local_e0.writer.buf.p + local_e0.writer.buf.n,local_f8);
                local_e0.writer.buf.n = local_e0.writer.buf.n + iVar3;
              }
              else {
                *local_e0.writer.buf.p = (u8)((uint)local_e0.writer.buf.n >> 8);
                local_e0.writer.buf.p[1] = (u8)local_e0.writer.buf.n;
                local_e0.writer.buf.n =
                     sqlite3Fts5PutVarint(local_e0.writer.buf.p + local_e0.writer.buf.n,v);
                iVar14 = local_134;
                local_e0.writer.buf.n = local_e0.writer.buf.n + iVar3;
                local_e0.bFirstRowidInPage = '\0';
                fts5WriteDlidxAppend(p,&local_e0,v);
                p_02 = local_68;
                if (p->rc != 0) break;
              }
              uVar19 = iVar18 + (uint)(byte)local_120;
              if (iVar14 == 1) {
                if (((int)uVar19 < (int)local_108) && (local_130[(int)uVar19] == '\0')) {
                  lVar20 = (long)local_e0.writer.buf.n + 1;
                  iVar18 = (int)lVar20;
                  local_e0.writer.buf.p[local_e0.writer.buf.n] = '\0';
                  uVar15 = (long)(int)uVar19 + 1;
                  if (((int)uVar15 < (int)local_108) && (local_130[uVar15] == '\0')) {
                    local_e0.writer.buf.n = local_e0.writer.buf.n + 2;
                    local_e0.writer.buf.p[lVar20] = '\0';
                    uVar19 = uVar19 + 2;
                    goto LAB_001ab323;
                  }
                }
                else {
LAB_001ab323:
                  uVar15 = (ulong)uVar19;
                  iVar18 = local_e0.writer.buf.n;
                }
                local_e0.writer.buf.n = iVar18;
                if (iVar11 <= local_e0.writer.pgidx.n + local_e0.writer.buf.n) {
                  fts5WriteFlushLeaf(p,&local_e0);
                }
                iVar18 = (int)uVar15;
              }
              else {
                p_01 = local_130 + (int)uVar19;
                local_14c = (uint)local_130[(int)uVar19];
                iVar14 = 1;
                if ((char)local_130[(int)uVar19] < '\0') {
                  iVar14 = sqlite3Fts5GetVarint32(p_01,&local_14c);
                }
                uVar16 = (int)local_14c / 2 + iVar14;
                iVar14 = local_e0.writer.buf.n + uVar16;
                local_128 = p_01;
                local_110 = uVar19;
                if (iVar11 < local_e0.writer.pgidx.n + iVar14) {
                  iVar14 = 0;
                  local_40 = (ulong)uVar16;
                  do {
                    uVar16 = (uint)local_40;
                    if (*pRc != 0) break;
                    local_38 = (long)local_e0.writer.buf.n;
                    local_120 = (ulong)(uint)local_e0.writer.pgidx.n;
                    iVar11 = iVar11 - (local_e0.writer.pgidx.n + local_e0.writer.buf.n);
                    iVar18 = uVar16 - iVar14;
                    lVar20 = (long)iVar14;
                    if (iVar11 < iVar18) {
                      p_00 = p_01 + lVar20;
                      local_50 = lVar20;
                      iVar18 = sqlite3Fts5GetVarint32(p_00,&local_14c);
                      p_01 = local_128;
                      lVar20 = local_50;
                      p = local_58;
                      if (iVar18 < iVar11) {
                        iVar3 = iVar18;
                        do {
                          iVar18 = iVar3;
                          iVar12 = sqlite3Fts5GetVarint32(p_00 + iVar18,&local_14c);
                          p_01 = local_128;
                          lVar20 = local_50;
                          p = local_58;
                          iVar3 = iVar12 + iVar18;
                        } while (iVar12 + iVar18 <= iVar11);
                      }
                    }
                    lVar2 = local_38;
                    memcpy(local_e0.writer.buf.p + local_38,p_01 + lVar20,(long)iVar18);
                    iVar11 = local_148;
                    local_e0.writer.buf.n = iVar18 + (int)lVar2;
                    if (local_148 <= local_e0.writer.buf.n + (int)local_120) {
                      fts5WriteFlushLeaf(p,&local_e0);
                    }
                    iVar14 = iVar14 + iVar18;
                    uVar16 = (uint)local_40;
                    pRc = local_48;
                  } while (iVar14 < (int)uVar16);
                }
                else {
                  memcpy(local_e0.writer.buf.p + local_e0.writer.buf.n,p_01,(long)(int)uVar16);
                  local_e0.writer.buf.n = iVar14;
                }
                iVar18 = uVar16 + local_110;
                iVar14 = local_134;
              }
              p_02 = local_68;
              if ((*pRc != 0) || ((int)local_108 <= iVar18)) break;
            } while( true );
          }
        }
        iVar18 = (int)in_R8;
        if (*pRc == 0) {
          p_02->pScan = p_02->pScan->pScanNext;
        }
        pFVar7 = local_68;
        iVar12 = local_134;
        piVar8 = local_48;
        pFVar9 = local_58;
        iVar3 = local_134;
        pFVar4 = local_68;
        pFVar5 = local_58;
        piVar6 = local_48;
        iVar11 = *pRc;
      }
      local_48 = piVar6;
      local_58 = pFVar5;
      local_68 = pFVar4;
      local_134 = iVar3;
      sqlite3Fts5HashClear(p_02);
      fts5WriteFinish(p,&local_e0,&local_144);
      if (local_60->nLevel == 0) {
        fts5StructureAddLevel(pRc,&local_140);
      }
      pStruct_00 = local_140;
      fts5StructureExtendLevel(pRc,local_140,0,0,iVar18);
      if (*pRc == 0) {
        pFVar1 = pStruct_00->aLevel[0].aSeg;
        iVar11 = pStruct_00->aLevel[0].nSeg;
        pStruct_00->aLevel[0].nSeg = iVar11 + 1;
        pFVar1[iVar11].iSegid = local_114;
        pFVar1[iVar11].pgnoFirst = 1;
        pFVar1[iVar11].pgnoLast = local_144;
        pStruct_00->nSegment = pStruct_00->nSegment + 1;
      }
      fts5StructurePromote(p,0,pStruct_00);
    }
    if ((p->rc == 0) && (iVar11 = p->pConfig->nAutomerge, 0 < iVar11)) {
      uVar15 = local_140->nWriteCounter;
      uVar17 = (long)local_144 + uVar15;
      iVar14 = p->nWorkUnit;
      local_140->nWriteCounter = uVar17;
      fts5IndexMerge(p,&local_140,
                     ((int)(uVar17 / (ulong)(long)iVar14) - (int)(uVar15 / (ulong)(long)iVar14)) *
                     iVar14 * local_140->nLevel,iVar11);
    }
    iVar11 = p->pConfig->nCrisisMerge;
    local_e0._0_8_ = local_140;
    if (p->rc == 0) {
      iVar14 = 1;
      lVar20 = 0x1c;
      do {
        if (*(int *)((long)(local_e0._0_8_ + 0x18) + lVar20 + -0x18) < iVar11) break;
        fts5IndexMergeLevel(p,(Fts5Structure **)&local_e0,iVar14 + -1,(int *)0x0);
        fts5StructurePromote(p,iVar14,(Fts5Structure *)local_e0._0_8_);
        iVar14 = iVar14 + 1;
        lVar20 = lVar20 + 0x10;
      } while (p->rc == 0);
    }
    pStruct_01 = local_e0._0_8_;
    local_140 = (Fts5Structure *)local_e0._0_8_;
    fts5StructureWrite(p,(Fts5Structure *)local_e0._0_8_);
    fts5StructureRelease((Fts5Structure *)pStruct_01);
  }
  return;
}

Assistant:

static void fts5IndexFlush(Fts5Index *p){
  /* Unless it is empty, flush the hash table to disk */
  if( p->nPendingData ){
    assert( p->pHash );
    p->nPendingData = 0;
    fts5FlushOneHash(p);
  }
}